

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O0

qreal QStyleHelper::dpi(QStyleOption *option)

{
  uint uVar1;
  int iVar2;
  long in_RDI;
  undefined8 local_8;
  
  uVar1 = QCoreApplication::testAttribute(AA_Use96Dpi);
  if ((uVar1 & 1) == 0) {
    if (in_RDI == 0) {
      iVar2 = qt_defaultDpiX();
      local_8 = (double)iVar2;
    }
    else {
      local_8 = (double)QFontMetrics::fontDpi();
    }
  }
  else {
    local_8 = 96.0;
  }
  return local_8;
}

Assistant:

Q_WIDGETS_EXPORT qreal dpi(const QStyleOption *option)
{
#ifndef Q_OS_DARWIN
    // Prioritize the application override, except for on macOS where
    // we have historically not supported the AA_Use96Dpi flag.
    if (QCoreApplication::testAttribute(Qt::AA_Use96Dpi))
        return 96;
#endif

    // Expect that QStyleOption::QFontMetrics::QFont has the correct DPI set
    if (option)
        return option->fontMetrics.fontDpi();

    // Fall back to historical Qt behavior: hardocded 72 DPI on mac,
    // primary screen DPI on other platforms.
#ifdef Q_OS_DARWIN
    return qstyleBaseDpi;
#else
    return qt_defaultDpiX();
#endif
}